

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

void __thiscall
google::protobuf::io::EpsCopyOutputStream::EpsCopyOutputStream
          (EpsCopyOutputStream *this,void *data,int size,bool deterministic)

{
  bool deterministic_local;
  int size_local;
  void *data_local;
  EpsCopyOutputStream *this_local;
  
  this->end_ = (uint8 *)((long)data + (long)size);
  this->buffer_end_ = (uint8 *)0x0;
  this->stream_ = (ZeroCopyOutputStream *)0x0;
  this->had_error_ = false;
  this->aliasing_enabled_ = false;
  this->is_serialization_deterministic_ = deterministic;
  return;
}

Assistant:

EpsCopyOutputStream(void* data, int size, bool deterministic)
      : end_(static_cast<uint8*>(data) + size),
        buffer_end_(nullptr),
        stream_(nullptr),
        is_serialization_deterministic_(deterministic) {}